

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionPdu.cpp
# Opt level: O3

bool __thiscall DIS::CollisionPdu::operator==(CollisionPdu *this,CollisionPdu *rhs)

{
  float fVar1;
  float fVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  ulong uVar4;
  undefined6 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined7 extraout_var;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [11];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar17 [12];
  undefined1 auVar22 [16];
  undefined1 auVar18 [13];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar24 [16];
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  byte bVar31;
  
  bVar7 = EntityInformationFamilyPdu::operator==
                    (&this->super_EntityInformationFamilyPdu,&rhs->super_EntityInformationFamilyPdu)
  ;
  bVar8 = EntityID::operator==(&this->_issuingEntityID,&rhs->_issuingEntityID);
  bVar9 = EntityID::operator==(&this->_collidingEntityID,&rhs->_collidingEntityID);
  bVar10 = EventIdentifier::operator==(&this->_eventID,&rhs->_eventID);
  uVar4._0_1_ = this->_collisionType;
  uVar4._1_1_ = this->_pad;
  uVar4._2_6_ = *(undefined6 *)&this->field_0x7a;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar4;
  uVar3 = rhs->_collisionType;
  uVar5 = rhs->_pad;
  uVar6 = *(undefined6 *)&rhs->field_0x7a;
  auVar19[0] = -(uVar3 == (undefined1)uVar4);
  cVar26 = -((char)uVar6 == (char)uVar4._2_6_);
  cVar27 = -((char)((uint6)uVar6 >> 8) == (char)((uint6)uVar4._2_6_ >> 8));
  cVar28 = -((char)((uint6)uVar6 >> 0x10) == (char)((uint6)uVar4._2_6_ >> 0x10));
  cVar29 = -((char)((uint6)uVar6 >> 0x18) == (char)((uint6)uVar4._2_6_ >> 0x18));
  cVar30 = -((char)((uint6)uVar6 >> 0x20) == (char)((uint6)uVar4._2_6_ >> 0x20));
  bVar31 = -((char)((uint6)uVar6 >> 0x28) == (char)((uint6)uVar4._2_6_ >> 0x28));
  auVar20._0_9_ = CONCAT18(0xff,(ulong)bVar31 << 0x38);
  auVar16._0_10_ = CONCAT19(0xff,auVar20._0_9_);
  auVar16[10] = 0xff;
  auVar17[0xb] = 0xff;
  auVar17._0_11_ = auVar16;
  auVar18[0xc] = 0xff;
  auVar18._0_12_ = auVar17;
  auVar25[0xd] = 0xff;
  auVar25._0_13_ = auVar18;
  auVar25[0xe] = bVar31;
  auVar25[0xf] = bVar31;
  auVar24._14_2_ = auVar25._14_2_;
  auVar24[0xd] = cVar30;
  auVar24._0_13_ = auVar18;
  auVar23._13_3_ = auVar24._13_3_;
  auVar23[0xc] = cVar30;
  auVar23._0_12_ = auVar17;
  auVar22._12_4_ = auVar23._12_4_;
  auVar22[0xb] = cVar29;
  auVar22._0_11_ = auVar16;
  auVar21._11_5_ = auVar22._11_5_;
  auVar21[10] = cVar29;
  auVar21._0_10_ = auVar16._0_10_;
  auVar20._10_6_ = auVar21._10_6_;
  auVar20[9] = cVar28;
  auVar19._8_8_ = (undefined8)(CONCAT72(auVar20._9_7_,CONCAT11(cVar28,bVar31)) >> 8);
  auVar19[7] = cVar27;
  auVar19[6] = cVar27;
  auVar19[5] = cVar26;
  auVar19[4] = cVar26;
  auVar19[3] = -(uVar5 == uVar4._1_1_);
  auVar19[2] = -(uVar5 == uVar4._1_1_);
  auVar19[1] = auVar19[0];
  auVar14 = pshuflw(auVar14,auVar19,0x50);
  auVar15._0_4_ = auVar14._0_4_;
  auVar15._4_4_ = auVar15._0_4_;
  auVar15._8_4_ = auVar14._4_4_;
  auVar15._12_4_ = auVar14._4_4_;
  uVar13 = movmskpd((int)CONCAT71(extraout_var,bVar9),auVar15);
  bVar11 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  fVar1 = this->_mass;
  fVar2 = rhs->_mass;
  bVar12 = Vector3Float::operator==(&this->_location,&rhs->_location);
  return (bool)(bVar12 & (byte)uVar13 >> 1 & ((bVar10 && bVar9) && (bVar8 && bVar7)) & (byte)uVar13
               & (bVar11 && fVar1 == fVar2));
}

Assistant:

bool CollisionPdu::operator ==(const CollisionPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityInformationFamilyPdu::operator==(rhs);

     if( ! (_issuingEntityID == rhs._issuingEntityID) ) ivarsEqual = false;
     if( ! (_collidingEntityID == rhs._collidingEntityID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_collisionType == rhs._collisionType) ) ivarsEqual = false;
     if( ! (_pad == rhs._pad) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;
     if( ! (_mass == rhs._mass) ) ivarsEqual = false;
     if( ! (_location == rhs._location) ) ivarsEqual = false;

    return ivarsEqual;
 }